

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputlag.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  nk_vec2 nVar2;
  undefined1 auVar3 [16];
  int iVar4;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar5;
  GLFWwindow *handle_00;
  nk_command_buffer *canvas;
  uint uVar6;
  ulong uVar7;
  int height_00;
  bool bVar8;
  ulong uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  int show_forecasts;
  int height;
  int width;
  GLFWwindow *local_70;
  ulong local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  nk_font_atlas *atlas;
  
  show_forecasts = 1;
  bVar8 = true;
  while( true ) {
    while( true ) {
      iVar4 = getopt(argc,argv,"fh");
      if (iVar4 != 0x66) break;
      bVar8 = false;
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x68) {
      usage();
LAB_0013c7a4:
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar4 = glfwInit();
  if (iVar4 == 0) {
LAB_0013c3ad:
    exit(1);
  }
  if (bVar8) {
    iVar4 = 0x280;
    height_00 = 0x1e0;
    handle = (GLFWmonitor *)0x0;
  }
  else {
    handle = glfwGetPrimaryMonitor();
    pGVar5 = glfwGetVideoMode(handle);
    iVar4 = pGVar5->width;
    height_00 = pGVar5->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  handle_00 = glfwCreateWindow(iVar4,height_00,"Input lag test",handle,(GLFWwindow *)0x0);
  if (handle_00 == (GLFWwindow *)0x0) {
    glfwTerminate();
    goto LAB_0013c3ad;
  }
  glfwMakeContextCurrent(handle_00);
  gladLoadGLLoader(glfwGetProcAddress);
  update_vsync();
  dVar1 = glfwGetTime();
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd;
  nk_glfw3_init(handle_00,NK_GLFW3_INSTALL_CALLBACKS);
  nk_glfw3_font_stash_begin(&atlas);
  nk_glfw3_font_stash_end();
  glfwSetKeyCallback(handle_00,key_callback);
  glfwSetCursorPosCallback(handle_00,cursor_pos_callback);
  local_58 = 0.0;
  dStack_50 = 0.0;
  uVar7 = 0;
  local_70 = handle_00;
  while( true ) {
    iVar4 = glfwWindowShouldClose(handle_00);
    if (iVar4 != 0) break;
    glfwPollEvents();
    sample_input(handle_00);
    glfwGetWindowSize(handle_00,&width,&height);
    local_68 = CONCAT44((float)height,(float)width);
    uStack_60 = 0;
    (*glad_glClear)(0x4000);
    nk_glfw3_new_frame();
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_68;
    iVar4 = nk_begin(&glfw.ctx,"",(nk_rect)(auVar3 << 0x40),0);
    if (iVar4 != 0) {
      local_68 = uVar7;
      canvas = nk_window_get_canvas(&glfw.ctx);
      for (iVar4 = (uint)(show_forecasts != 0) * 3; -1 < iVar4; iVar4 = iVar4 + -1) {
        nVar2.y = (float)iVar4 * cursor_vel.y + cursor_pos.y;
        nVar2.x = (float)iVar4 * cursor_vel.x + cursor_pos.x;
        draw_marker(canvas,iVar4,nVar2);
      }
      nk_layout_row_dynamic(&glfw.ctx,20.0,1);
      nk_label(&glfw.ctx,"Move mouse uniformly and check marker under cursor:",0x11);
      for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
        nk_layout_row_begin(&glfw.ctx,NK_STATIC,12.0,2);
        nk_layout_row_push(&glfw.ctx,25.0);
        nVar2 = nk_layout_space_to_screen(&glfw.ctx,(nk_vec2)0x40a0000041a00000);
        draw_marker(canvas,uVar6,nVar2);
        nk_label(&glfw.ctx,"",0);
        nk_layout_row_push(&glfw.ctx,500.0);
        if (uVar6 == 0) {
          nk_label(&glfw.ctx,"- current cursor position (no input lag)",0x11);
        }
        else {
          nk_labelf(&glfw.ctx,0x11,"- %d-frame forecast (input lag is %d frame)",(ulong)uVar6,
                    (ulong)uVar6);
        }
        nk_layout_row_end(&glfw.ctx);
      }
      nk_layout_row_dynamic(&glfw.ctx,20.0,1);
      nk_checkbox_label(&glfw.ctx,"Show forecasts",&show_forecasts);
      nk_label(&glfw.ctx,"Input method:",0x11);
      iVar4 = nk_option_label(&glfw.ctx,"glfwGetCursorPos (sync query)",
                              (uint)(cursor_method == NK_DO_NOT_STOP_ON_NEW_LINE));
      uVar7 = local_68;
      handle_00 = local_70;
      if (iVar4 == 0) {
        uVar6 = (uint)(cursor_method == NK_STOP_ON_NEW_LINE);
      }
      else {
        cursor_method = NK_DO_NOT_STOP_ON_NEW_LINE;
        uVar6 = 0;
      }
      iVar4 = nk_option_label(&glfw.ctx,"glfwSetCursorPosCallback (latest input message)",uVar6);
      if (iVar4 != 0) {
        cursor_method = NK_STOP_ON_NEW_LINE;
      }
      nk_label(&glfw.ctx,"",0);
      nk_value_float(&glfw.ctx,"FPS",(float)local_58);
      iVar4 = nk_checkbox_label(&glfw.ctx,"Enable vsync",&enable_vsync);
      if (iVar4 != 0) {
        update_vsync();
      }
      nk_label(&glfw.ctx,"",0);
      nk_label(&glfw.ctx,"After swap:",0x11);
      nk_checkbox_label(&glfw.ctx,"glClear",&swap_clear);
      nk_checkbox_label(&glfw.ctx,"glFinish",&swap_finish);
      nk_checkbox_label(&glfw.ctx,"draw with occlusion query",&swap_occlusion_query);
      nk_checkbox_label(&glfw.ctx,"glReadPixels",&swap_read_pixels);
    }
    nk_end(&glfw.ctx);
    nk_glfw3_render(NK_ANTI_ALIASING_ON);
    swap_buffers(handle_00);
    uVar7 = uVar7 + 1;
    dVar1 = glfwGetTime();
    dVar10 = dVar1 - (double)local_48._0_8_;
    auVar11._8_4_ = (int)(uVar7 >> 0x20);
    auVar11._0_8_ = uVar7;
    auVar11._12_4_ = 0x45300000;
    dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
    if (1.0 < dVar10) {
      local_58 = (dVar12 + ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) / dVar10;
      dStack_50 = dVar12;
    }
    uVar9 = -(ulong)(1.0 < dVar10);
    if (1.0 < dVar10) {
      uVar7 = 0;
    }
    local_48._0_8_ =
         ~uVar9 & local_48._0_8_ |
         CONCAT44((uint)((ulong)dVar1 >> 0x20) & (uint)(uVar9 >> 0x20),SUB84(dVar1,0) & (uint)uVar9)
    ;
  }
  glfwTerminate();
  goto LAB_0013c7a4;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    unsigned long frame_count = 0;
    double last_time, current_time;
    double frame_rate = 0;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    int show_forecasts = nk_true;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(width, height, "Input lag test", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    update_vsync();

    last_time = glfwGetTime();

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);
    glfwSetCursorPosCallback(window, cursor_pos_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwPollEvents();
        sample_input(window);

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            nk_flags align_left = NK_TEXT_ALIGN_LEFT | NK_TEXT_ALIGN_MIDDLE;
            struct nk_command_buffer *canvas = nk_window_get_canvas(nk);
            int lead;

            for (lead = show_forecasts ? 3 : 0; lead >= 0; lead--)
                draw_marker(canvas, lead, nk_vec2(cursor_pos.x + cursor_vel.x * lead,
                                                  cursor_pos.y + cursor_vel.y * lead));

            // print instructions
            nk_layout_row_dynamic(nk, 20, 1);
            nk_label(nk, "Move mouse uniformly and check marker under cursor:", align_left);
            for (lead = 0; lead <= 3; lead++) {
                nk_layout_row_begin(nk, NK_STATIC, 12, 2);
                nk_layout_row_push(nk, 25);
                draw_marker(canvas, lead, nk_layout_space_to_screen(nk, nk_vec2(20, 5)));
                nk_label(nk, "", 0);
                nk_layout_row_push(nk, 500);
                if (lead == 0)
                    nk_label(nk, "- current cursor position (no input lag)", align_left);
                else
                    nk_labelf(nk, align_left, "- %d-frame forecast (input lag is %d frame)", lead, lead);
                nk_layout_row_end(nk);
            }

            nk_layout_row_dynamic(nk, 20, 1);

            nk_checkbox_label(nk, "Show forecasts", &show_forecasts);
            nk_label(nk, "Input method:", align_left);
            if (nk_option_label(nk, "glfwGetCursorPos (sync query)", cursor_method == cursor_sync_query))
                cursor_method = cursor_sync_query;
            if (nk_option_label(nk, "glfwSetCursorPosCallback (latest input message)", cursor_method == cursor_input_message))
                cursor_method = cursor_input_message;

            nk_label(nk, "", 0); // separator

            nk_value_float(nk, "FPS", (float) frame_rate);
            if (nk_checkbox_label(nk, "Enable vsync", &enable_vsync))
                update_vsync();

            nk_label(nk, "", 0); // separator

            nk_label(nk, "After swap:", align_left);
            nk_checkbox_label(nk, "glClear", &swap_clear);
            nk_checkbox_label(nk, "glFinish", &swap_finish);
            nk_checkbox_label(nk, "draw with occlusion query", &swap_occlusion_query);
            nk_checkbox_label(nk, "glReadPixels", &swap_read_pixels);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        swap_buffers(window);

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}